

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,ModuleInstantiationStmt *stmt)

{
  uint64_t *puVar1;
  char cVar2;
  size_t sVar3;
  __node_base _Var4;
  pointer pbVar5;
  SystemVerilogCodeGen *pSVar6;
  Generator *pGVar7;
  int iVar8;
  ostream *poVar9;
  long lVar10;
  Generator *pGVar11;
  ulong uVar12;
  iterator iVar13;
  long *plVar14;
  VarException *this_00;
  char cVar15;
  ModuleInstantiationStmt *pMVar16;
  undefined1 auVar17 [8];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 *puVar18;
  pointer *pppIVar19;
  Generator *pGVar20;
  bool bVar21;
  byte bVar22;
  string_view sVar23;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  undefined1 local_228 [8];
  map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  debug_info;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>_>
  params_;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 auStack_198 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_names;
  long *local_178 [2];
  long local_168 [2];
  char local_158;
  long *local_150;
  size_t local_148;
  long local_140 [2];
  char local_130;
  long *local_128;
  size_t local_120;
  long local_118 [2];
  byte local_108;
  ModuleInstantiationStmt *local_100;
  Generator *local_f8;
  undefined1 local_f0 [16];
  undefined1 auStack_e0 [8];
  string value;
  string local_b8;
  undefined1 local_98;
  ModuleInstantiationStmt *local_90;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_88;
  pointer pcStack_70;
  ModuleInstantiationStmt *local_68;
  size_type sStack_60;
  SystemVerilogCodeGen *local_50;
  ostream *local_48;
  allocator_type local_39;
  Generator *local_38;
  
  local_50 = this;
  if ((stmt->super_Stmt).super_IRNode.comment._M_string_length != 0) {
    sVar23 = indent(this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&(this->stream_).super_stringstream.field_0x10,sVar23._M_str,
                        sVar23._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"// ",3);
    strip_newline((string *)&debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  &(stmt->super_Stmt).super_IRNode.comment);
    this = local_50;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(char *)debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (long)params_._M_h._M_buckets);
    puVar18 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar18 = *(long *)puVar18 + 1;
    local_88.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_88.
                           super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_88,1);
    if ((size_type *)debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        &params_._M_h._M_bucket_count) {
      operator_delete((void *)debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      params_._M_h._M_bucket_count + 1);
    }
  }
  (stmt->super_Stmt).super_IRNode.verilog_ln =
       *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  puVar18 = &(this->stream_).super_stringstream.field_0x10;
  sVar23 = indent(this);
  local_48 = (ostream *)puVar18;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar18,sVar23._M_str,sVar23._M_len);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,(stmt->target_->name)._M_dataplus._M_p,(stmt->target_->name)._M_string_length);
  pGVar20 = stmt->target_;
  std::
  _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  ::_Rb_tree((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
              *)local_228,&(stmt->super_InstantiationStmt).port_debug_._M_t);
  debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&params_._M_h._M_rehash_policy._M_next_resize;
  params_._M_h._M_buckets = (__buckets_ptr)0x1;
  params_._M_h._M_bucket_count = 0;
  params_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  params_._M_h._M_element_count._0_4_ = 0x3f800000;
  params_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  params_._M_h._M_rehash_policy._4_4_ = 0;
  params_._M_h._M_rehash_policy._M_next_resize = 0;
  pGVar11 = (Generator *)(pGVar20->params_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pGVar20 = (Generator *)&(pGVar20->params_)._M_t._M_impl.super__Rb_tree_header;
  pMVar16 = stmt;
  pGVar7 = pGVar20;
  if (pGVar11 != pGVar20) {
    do {
      local_38 = pGVar7;
      local_90 = pMVar16;
      pMVar16 = *(ModuleInstantiationStmt **)((long)&(pGVar11->super_IRNode).comment.field_2 + 8);
      if (((*(long *)&pMVar16[2].super_Stmt.scope_context_._M_t._M_impl.super__Rb_tree_header.
                      _M_header != 0) ||
          ((*(byte *)((long)&pMVar16[2].super_Stmt.scope_context_._M_t._M_impl.super__Rb_tree_header
                             ._M_header + 0x18) & 1) == 0)) ||
         (*(_Base_ptr *)
           ((long)&pMVar16[2].super_Stmt.scope_context_._M_t._M_impl.super__Rb_tree_header._M_header
           + 0x10) !=
          *(_Base_ptr *)
           ((long)&pMVar16[1].super_InstantiationStmt.port_debug_._M_t._M_impl.super__Rb_tree_header
                   ._M_header + 8))) {
        if (*(int *)&pMVar16[1].super_InstantiationStmt.connection_stmt_._M_h._M_single_bucket == 3)
        {
          local_68 = (ModuleInstantiationStmt *)((ulong)local_68 & 0xffffffffffffff00);
          cVar2 = *(char *)((long)&pMVar16[2].super_InstantiationStmt.port_mapping_._M_t._M_impl.
                                   super__Rb_tree_header._M_header + 8);
          if (cVar2 == '\x01') {
            sVar3 = pMVar16[2].super_Stmt.scope_context_._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count;
            local_88.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)&local_88.
                           super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,sVar3,
                       (long)pMVar16[2].super_InstantiationStmt._vptr_InstantiationStmt + sVar3);
            local_68 = (ModuleInstantiationStmt *)CONCAT71(local_68._1_7_,1);
            lVar10 = *(long *)((long)&(pGVar11->super_IRNode).comment.field_2 + 8);
            local_158 = '\0';
            if (*(char *)(lVar10 + 0x3d0) != '\x01') goto LAB_002199bd;
            local_178[0] = local_168;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_178,*(long *)(lVar10 + 0x3b0),
                       *(long *)(lVar10 + 0x3b8) + *(long *)(lVar10 + 0x3b0));
            local_158 = '\x01';
            lVar10 = *(long *)((long)&(pGVar11->super_IRNode).comment.field_2 + 8);
            local_130 = 0;
            bVar21 = *(char *)(lVar10 + 0x3a8) == '\x01';
            if (bVar21) {
              local_150 = local_140;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_150,*(long *)(lVar10 + 0x388),
                         *(long *)(lVar10 + 0x390) + *(long *)(lVar10 + 0x388));
              lVar10 = *(long *)((long)&(pGVar11->super_IRNode).comment.field_2 + 8);
            }
            local_108 = 0;
            bVar22 = *(char *)(lVar10 + 0x3d0) == '\x01';
            local_130 = bVar21;
            if ((bool)bVar22) {
              local_128 = local_118;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_128,*(long *)(lVar10 + 0x3b0),
                         *(long *)(lVar10 + 0x3b8) + *(long *)(lVar10 + 0x3b0));
            }
            bVar21 = true;
            local_108 = bVar22;
            if (local_148 != local_120) goto LAB_002199c0;
            if (local_148 == 0) {
              cVar15 = '\x01';
            }
            else {
              iVar8 = bcmp(local_150,local_128,local_148);
              bVar21 = true;
              cVar15 = '\x01';
              if (iVar8 != 0) goto LAB_002199c0;
            }
LAB_00219aa6:
            if (((bVar22 & 1) != 0) && (local_108 = 0, local_128 != local_118)) {
              operator_delete(local_128,local_118[0] + 1);
            }
            if ((local_130 == '\x01') && (local_130 = '\0', local_150 != local_140)) {
              operator_delete(local_150,local_140[0] + 1);
            }
          }
          else {
LAB_002199bd:
            bVar21 = false;
LAB_002199c0:
            lVar10 = *(long *)((long)&(pGVar11->super_IRNode).comment.field_2 + 8);
            value.field_2._M_local_buf[8] = '\0';
            if (*(char *)(lVar10 + 0x3a8) == '\x01') {
              auStack_e0 = (undefined1  [8])&value._M_string_length;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)auStack_e0,*(long *)(lVar10 + 0x388),
                         *(long *)(lVar10 + 0x390) + *(long *)(lVar10 + 0x388));
              cVar15 = '\0';
LAB_00219a71:
              value.field_2._M_local_buf[8] = '\0';
              if (auStack_e0 != (undefined1  [8])&value._M_string_length) {
                operator_delete((void *)auStack_e0,value._M_string_length + 1);
              }
            }
            else {
              lVar10 = *(long *)((long)&(pGVar11->super_IRNode).comment.field_2 + 8);
              local_98 = 0;
              cVar15 = *(char *)(lVar10 + 0x3d0);
              if (cVar15 == '\x01') {
                local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_b8,*(long *)(lVar10 + 0x3b0),
                           *(long *)(lVar10 + 0x3b8) + *(long *)(lVar10 + 0x3b0));
                local_98 = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
              }
              if ((value.field_2._M_local_buf[8] & 1U) != 0) goto LAB_00219a71;
            }
            bVar22 = local_108;
            if (bVar21) goto LAB_00219aa6;
          }
          pGVar20 = local_38;
          if (((cVar2 != '\0') && (local_158 == '\x01')) &&
             (local_158 = '\0', local_178[0] != local_168)) {
            operator_delete(local_178[0],local_168[0] + 1);
          }
          if (((char)local_68 == '\x01') &&
             (local_68 = (ModuleInstantiationStmt *)((ulong)local_68 & 0xffffffffffffff00),
             local_88.
             super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             (pointer)&local_88.
                       super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
            operator_delete(local_88.
                            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)local_88.
                                          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
          if (cVar15 != '\0') goto LAB_00219bb3;
          pMVar16 = *(ModuleInstantiationStmt **)
                     ((long)&(pGVar11->super_IRNode).comment.field_2 + 8);
        }
        pppIVar19 = &local_88.
                     super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        lVar10 = *(long *)&(pGVar11->super_IRNode).verilog_ln;
        local_88.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pppIVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,lVar10,
                   (pGVar11->super_IRNode).comment._M_dataplus._M_p + lVar10);
        local_68 = pMVar16;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Param*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Param*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string,kratos::Param*>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Param*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Param*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)&local_88);
        if (local_88.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)pppIVar19) {
          operator_delete(local_88.
                          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)local_88.
                                        super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
      }
LAB_00219bb3:
      pGVar11 = (Generator *)std::_Rb_tree_increment((_Rb_tree_node_base *)pGVar11);
      pMVar16 = local_90;
      pGVar7 = local_38;
    } while (pGVar11 != pGVar20);
    stmt = local_90;
    if (params_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      auStack_198 = (undefined1  [8])0x0;
      param_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      param_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_198,(size_type)params_._M_h._M_before_begin._M_nxt);
      pSVar6 = local_50;
      if (params_._M_h._M_bucket_count != 0) {
        plVar14 = (long *)params_._M_h._M_bucket_count;
        do {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     auStack_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (plVar14 + 1));
          plVar14 = (long *)*plVar14;
        } while (plVar14 != (long *)0x0);
      }
      pbVar5 = param_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar17 = auStack_198;
      if (auStack_198 !=
          (undefined1  [8])
          param_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar12 = (long)param_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_198 >> 5;
        lVar10 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (auStack_198,
                   param_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (auVar17,pbVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_48," #(",3);
      puVar18 = &(pSVar6->stream_).super_stringstream.field_0x90;
      *(long *)puVar18 = *(long *)puVar18 + 1;
      local_88.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_88.
                             super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(local_48,(char *)&local_88,1);
      puVar1 = &pSVar6->indent_;
      *puVar1 = *puVar1 + 1;
      params_._M_h._M_single_bucket =
           (__node_base_ptr)
           param_names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      stmt = local_90;
      if (auStack_198 !=
          (undefined1  [8])
          param_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pGVar20 = (Generator *)0x1;
        auVar17 = auStack_198;
        do {
          iVar13 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)auVar17);
          if (iVar13.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          Param::value_str_abi_cxx11_
                    ((string *)auStack_e0,
                     *(Param **)
                      ((long)iVar13.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_true>
                             ._M_cur + 0x28));
          plVar14 = *(long **)(*(long *)((long)iVar13.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_true>
                                               ._M_cur + 0x28) + 0x368);
          if (plVar14 != (long *)0x0) {
            local_38 = (Generator *)(**(code **)(*plVar14 + 0x68))(plVar14);
            pGVar11 = Stmt::generator_parent(&stmt->super_Stmt);
            if (local_38 != pGVar11) {
              this_00 = (VarException *)__cxa_allocate_exception(0x10);
              pGVar20 = Stmt::generator_parent(&stmt->super_Stmt);
              local_88.
              super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)(local_38->name)._M_dataplus._M_p;
              local_88.
              super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)(local_38->name)._M_string_length
              ;
              local_88.
              super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar14[0xf];
              pcStack_70 = (pointer)plVar14[0x10];
              local_68 = (ModuleInstantiationStmt *)(pGVar20->name)._M_dataplus._M_p;
              sStack_60 = (pGVar20->name)._M_string_length;
              format_str_00.size_ = 0xddd;
              format_str_00.data_ = (char *)0x28;
              args_00.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.args_ = in_R9.args_;
              args_00.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)&local_88;
              fmt::v7::detail::vformat_abi_cxx11_
                        (&local_b8,(detail *)"{0}.{1} is not declared in generator {2}",
                         format_str_00,args_00);
              local_100 = local_90;
              local_f8 = local_38;
              __l._M_len = 3;
              __l._M_array = (iterator)&local_100;
              local_f0._0_8_ = plVar14;
              std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                        (&local_88,__l,&local_39);
              VarException::VarException(this_00,&local_b8,&local_88);
              __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          sVar23 = indent(local_50);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_48,sVar23._M_str,sVar23._M_len);
          _Var4 = params_._M_h._M_before_begin;
          local_38 = pGVar20;
          if ((Generator *)params_._M_h._M_before_begin._M_nxt == pGVar20) {
            local_100 = (ModuleInstantiationStmt *)local_f0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,")","");
          }
          else {
            puVar18 = &(local_50->stream_).super_stringstream.field_0x90;
            *(long *)puVar18 = *(long *)puVar18 + 1;
            local_1b8[0] = local_1a8;
            std::__cxx11::string::_M_construct((ulong)local_1b8,'\x01');
            plVar14 = (long *)std::__cxx11::string::replace((ulong)local_1b8,0,(char *)0x0,0x23926c)
            ;
            local_100 = (ModuleInstantiationStmt *)local_f0;
            pMVar16 = (ModuleInstantiationStmt *)(plVar14 + 2);
            if ((ModuleInstantiationStmt *)*plVar14 == pMVar16) {
              local_f0._0_8_ = (pMVar16->super_Stmt).super_IRNode._vptr_IRNode;
              local_f0._8_8_ = plVar14[3];
            }
            else {
              local_f0._0_8_ = (pMVar16->super_Stmt).super_IRNode._vptr_IRNode;
              local_100 = (ModuleInstantiationStmt *)*plVar14;
            }
            local_f8 = (Generator *)plVar14[1];
            *plVar14 = (long)pMVar16;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
          }
          local_88.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)(((key_type *)auVar17)->_M_dataplus)._M_p;
          local_88.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)((key_type *)auVar17)->_M_string_length;
          local_88.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_e0;
          pcStack_70 = value._M_dataplus._M_p;
          local_68 = local_100;
          sStack_60 = (size_type)local_f8;
          format_str.size_ = 0xddd;
          format_str.data_ = (char *)0xc;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_88;
          fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)".{0}({1}){2}",format_str,args);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_b8._M_dataplus._M_p,local_b8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (local_100 != (ModuleInstantiationStmt *)local_f0) {
            operator_delete(local_100,local_f0._0_8_ + 1);
          }
          stmt = local_90;
          if (((Generator *)_Var4._M_nxt != local_38) && (local_1b8[0] != local_1a8)) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
          if (auStack_e0 != (undefined1  [8])&value._M_string_length) {
            operator_delete((void *)auStack_e0,value._M_string_length + 1);
          }
          auVar17 = (undefined1  [8])((long)auVar17 + 0x20);
          pGVar20 = (Generator *)(ulong)((int)pGVar20 + 1);
        } while (auVar17 != (undefined1  [8])params_._M_h._M_single_bucket);
      }
      pSVar6 = local_50;
      puVar18 = &(local_50->stream_).super_stringstream.field_0x90;
      *(long *)puVar18 = *(long *)puVar18 + 1;
      local_88.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_88.
                             super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(local_48,(char *)&local_88,1);
      pSVar6->indent_ = pSVar6->indent_ - 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_198);
      poVar9 = local_48;
      goto LAB_00219fb9;
    }
  }
  poVar9 = local_48;
  std::__ostream_insert<char,std::char_traits<char>>(local_48," ",1);
LAB_00219fb9:
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,(stmt->target_->instance_name)._M_dataplus._M_p,
             (stmt->target_->instance_name)._M_string_length);
  generate_port_interface(local_50,&stmt->super_InstantiationStmt);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  ::~_Rb_tree((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
               *)local_228);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(ModuleInstantiationStmt* stmt) {
    // comment
    if (!stmt->comment.empty()) {
        stream_ << indent() << "// " << strip_newline(stmt->comment) << stream_.endl();
    }
    stmt->verilog_ln = stream_.line_no();
    stream_ << indent() << stmt->target()->name;
    const auto& params = stmt->target()->get_params();
    auto debug_info = stmt->port_debug();

    // pre-filter the parameters if the initial value is the same as the current value
    std::unordered_map<std::string, Param*> params_;
    for (auto const& [name, param] : params) {
        if (!param->parent_param() && param->get_initial_value() &&
            (*param->get_initial_value()) == param->value()) {
            continue;
        }
        // could be raw string type as well
        if (param->param_type() == ParamType::RawType &&
            ((param->get_raw_str_value() && param->get_raw_str_initial_value() &&
              (*param->get_raw_str_value()) == (*param->get_raw_str_initial_value())) ||
             (!param->get_raw_str_value() && param->get_raw_str_initial_value()))) {
            continue;
        }
        params_.emplace(std::make_pair(name, param.get()));
    }

    if (!params_.empty()) {
        std::vector<std::string> param_names;
        param_names.reserve(params_.size());
        for (auto const& iter : params_) {
            param_names.emplace_back(iter.first);
        }
        std::sort(param_names.begin(), param_names.end());
        stream_ << " #(" << stream_.endl();
        indent_++;

        uint32_t count = 0;
        for (auto const& name : param_names) {
            auto const& param = params_.at(name);
            auto value = param->value_str();
            if (param->parent_param()) {
                const auto* p = param->parent_param();
                // checking on parameter parent
                auto* p_gen = p->generator();
                if (p_gen != stmt->generator_parent()) {
                    throw VarException(
                        ::format("{0}.{1} is not declared in generator {2}", p_gen->name, p->name,
                                 stmt->generator_parent()->name),
                        {stmt, p_gen, p});
                }
            }
            stream_ << indent()
                    << ::format(
                           ".{0}({1}){2}", name, value,
                           ++count == params_.size() ? ")" : "," + std::string(1, stream_.endl()));
        }

        // start a new line
        stream_ << stream_.endl();
        indent_--;
    } else {
        stream_ << " ";
    }
    stream_ << stmt->target()->instance_name;
    generate_port_interface(stmt);
}